

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

FileInfo * __thiscall slang::SourceManager::getFileInfo(SourceManager *this,BufferID buffer)

{
  pointer pvVar1;
  ulong uVar2;
  FileInfo *pFVar3;
  shared_lock<std::shared_mutex> lock;
  
  if (buffer.id == 0) {
    pFVar3 = (FileInfo *)0x0;
  }
  else {
    uVar2 = (ulong)buffer.id;
    lock._M_owns = true;
    lock._M_pm = &this->mut;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->bufferEntries).
                       super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x38) <= uVar2)
    {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0x1bd,"SourceManager::FileInfo *slang::SourceManager::getFileInfo(BufferID)");
    }
    pFVar3 = (FileInfo *)0x0;
    if (*(__index_type *)
         ((long)&pvVar1[uVar2].
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
         + 0x30) == '\0') {
      pFVar3 = (FileInfo *)(pvVar1 + uVar2);
    }
    std::shared_lock<std::shared_mutex>::~shared_lock(&lock);
  }
  return pFVar3;
}

Assistant:

void SourceManager::addUserDirectory(string_view path) {
    std::unique_lock lock(mut);
    userDirectories.push_back(fs::canonical(widen(path)));
}